

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Rips_filtration(Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                  *this,Sparse_distance_matrix<Params> *_dist,dimension_t _dim_max,
                 value_t _threshold,coefficient_t _modulus)

{
  vertex_t vVar1;
  int iVar2;
  int *piVar3;
  int local_2c;
  int local_28;
  coefficient_t local_24;
  value_t local_20;
  coefficient_t _modulus_local;
  value_t _threshold_local;
  dimension_t _dim_max_local;
  Sparse_distance_matrix<Params> *_dist_local;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *this_local;
  
  local_24 = _modulus;
  local_20 = _threshold;
  _modulus_local._3_1_ = _dim_max;
  __threshold_local = _dist;
  _dist_local = &this->dist;
  Sparse_distance_matrix<Params>::Sparse_distance_matrix(&this->dist,_dist);
  vVar1 = Sparse_distance_matrix<Params>::size(&this->dist);
  this->n = vVar1;
  local_28 = (int)_modulus_local._3_1_;
  vVar1 = Sparse_distance_matrix<Params>::size(&this->dist);
  local_2c = vVar1 + -2;
  piVar3 = std::min<int>(&local_28,&local_2c);
  this->dim_max = (dimension_t)*piVar3;
  this->threshold = local_20;
  this->modulus = local_24;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Cns_encoding
            (&this->simplex_encoding,this->n,(char)*(undefined4 *)&this->dim_max + '\x02');
  std::vector<int,_std::allocator<int>_>::vector(&this->vertices);
  iVar2 = log2up<unsigned_int>(this->modulus - 1);
  this->bits_for_coeff = iVar2;
  return;
}

Assistant:

Rips_filtration(DistanceMatrix&& _dist, dimension_t _dim_max, value_t _threshold, coefficient_t _modulus)
    : dist(std::move(_dist)), n(dist.size()),
    dim_max(std::min<vertex_t>(_dim_max, dist.size() - 2)), threshold(_threshold),
    modulus(_modulus), simplex_encoding(n, dim_max + 2), bits_for_coeff(log2up(modulus-1)) {
      // See entry_with_coeff_t for the logic for log2up(modulus-1) (storing coeff-1)
      if (use_coefficients && simplex_encoding.num_extra_bits() < num_bits_for_coeff())
        // TODO: include relevant numbers in the message
        throw std::overflow_error("Not enough spare bits in the simplex encoding to store a coefficient");
    }